

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

void N_VFreeEmpty(N_Vector v)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
    }
    *(undefined8 *)((long)in_RDI + 8) = 0;
    free(in_RDI);
  }
  return;
}

Assistant:

void N_VFreeEmpty(N_Vector v)
{
  if (v == NULL)  return;

  /* free non-NULL ops structure */
  if (v->ops)  free(v->ops);
  v->ops = NULL;

  /* free overall N_Vector object and return */
  free(v);
  return;
}